

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,string *name)

{
  cmSourceGroup *pcVar1;
  __type _Var2;
  cmSourceGroup *group;
  cmSourceGroup *__lhs;
  
  __lhs = (this->Internal->GroupChildren).
          super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
          super__Vector_impl_data._M_start;
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pcVar1) {
      return (cmSourceGroup *)0x0;
    }
    _Var2 = std::operator==(&__lhs->Name,name);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  return __lhs;
}

Assistant:

cmSourceGroup* cmSourceGroup::LookupChild(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    // look if descenened is the one were looking for
    if (group.GetName() == name) {
      return (&group); // if it so return it
    }
  }

  // if no child with this name was found return NULL
  return nullptr;
}